

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O0

void __thiscall
stackjit::ByteCodeParser::parseInstruction(ByteCodeParser *this,Function *currentFunction)

{
  OpCodes opCode_00;
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  AttributeContainer *container;
  size_type sVar5;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar6;
  mapped_type *pmVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference this_01;
  size_t sVar8;
  runtime_error *prVar9;
  float fVar10;
  bool local_c15;
  OpCodes local_bee;
  ByteCodeParser local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0 [32];
  undefined1 local_aa0 [136];
  Instruction local_a18;
  ByteCodeParser local_9b0;
  int target_1;
  ByteCodeParser local_920;
  undefined1 local_8f8 [4];
  int target;
  string local_8e0 [32];
  Instruction local_8c0;
  undefined1 local_858 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters_1;
  string local_820 [32];
  string local_800 [32];
  long local_7e0;
  size_type classNamePosition_1;
  string local_7d0 [8];
  string classType_1;
  undefined1 local_7b0 [8];
  string funcName_1;
  Instruction local_790;
  ByteCodeParser local_728;
  undefined1 local_700 [4];
  int argumentNum;
  string local_6e8 [32];
  Instruction local_6c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_660;
  string local_648 [32];
  string local_628 [32];
  Instruction local_608;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a0;
  string local_588 [32];
  string local_568 [32];
  Instruction local_548;
  undefined1 local_4e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string local_4a8 [32];
  string local_488 [32];
  long local_468;
  size_type classNamePosition;
  string local_458 [8];
  string classType;
  undefined1 local_438 [8];
  string funcName;
  undefined1 local_410 [6];
  bool isVirtual;
  bool isInstance;
  OpCodes local_3a1;
  undefined1 local_3a0 [7];
  OpCodes opCode;
  int local_37c;
  undefined1 local_378 [4];
  int local;
  string localType;
  ByteCodeParser local_358;
  undefined1 local_330 [4];
  int localIndex;
  int local_30c;
  string local_308 [4];
  int localsCount;
  Instruction local_2e8;
  undefined1 local_280 [8];
  string value_3;
  Instruction local_260;
  Instruction local_1f8;
  ByteCodeParser local_190;
  undefined1 local_168 [7];
  char value_2;
  undefined1 local_100 [40];
  float value_1;
  ByteCodeParser local_70;
  undefined4 local_48;
  int value;
  undefined1 local_38 [8];
  string currentToLower;
  Function *currentFunction_local;
  ByteCodeParser *this_local;
  
  currentTokenToLower_abi_cxx11_((ByteCodeParser *)local_38);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"@");
  if (bVar2) {
    container = Loader::Function::attributes_abi_cxx11_(currentFunction);
    parseAttribute(this,container);
    local_48 = 1;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"ldint");
    if (bVar2) {
      nextToken_abi_cxx11_(&local_70);
      iVar4 = std::__cxx11::stoi((string *)&local_70,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_70);
      local_70._36_4_ = iVar4;
      pvVar6 = Loader::Function::instructions(currentFunction);
      Loader::Instruction::makeWithInt
                ((Instruction *)&stack0xffffffffffffff28,LOAD_INT,local_70._36_4_);
      std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
      push_back(pvVar6,(value_type *)&stack0xffffffffffffff28);
      Loader::Instruction::~Instruction((Instruction *)&stack0xffffffffffffff28);
      local_48 = 1;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"ldfloat");
      if (bVar2) {
        nextToken_abi_cxx11_((ByteCodeParser *)local_100);
        fVar10 = std::__cxx11::stof((string *)local_100,(size_t *)0x0);
        std::__cxx11::string::~string((string *)local_100);
        local_100._36_4_ = fVar10;
        pvVar6 = Loader::Function::instructions(currentFunction);
        Loader::Instruction::makeWithFloat
                  ((Instruction *)local_168,LOAD_FLOAT,(float)local_100._36_4_);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar6,(value_type *)local_168);
        Loader::Instruction::~Instruction((Instruction *)local_168);
        local_48 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"ldchar");
        if (bVar2) {
          nextToken_abi_cxx11_(&local_190);
          iVar4 = std::__cxx11::stoi((string *)&local_190,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&local_190);
          local_190._39_1_ = (char)iVar4;
          pvVar6 = Loader::Function::instructions(currentFunction);
          Loader::Instruction::makeWithChar(&local_1f8,LOAD_CHAR,local_190._39_1_);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::push_back(pvVar6,&local_1f8);
          Loader::Instruction::~Instruction(&local_1f8);
          local_48 = 1;
        }
        else {
          sVar5 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                  ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                           *)(anonymous_namespace)::noOperandsInstructions_abi_cxx11_,
                          (key_type *)local_38);
          if (sVar5 == 0) {
            sVar5 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                    ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                             *)(anonymous_namespace)::stringOperandInstructions_abi_cxx11_,
                            (key_type *)local_38);
            if (sVar5 == 0) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,".locals");
              if (bVar2) {
                if ((this->mLocalsSet & 1U) != 0) {
                  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar9,"The locals has already been set.");
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                nextToken_abi_cxx11_((ByteCodeParser *)local_330);
                iVar4 = std::__cxx11::stoi((string *)local_330,(size_t *)0x0,10);
                std::__cxx11::string::~string((string *)local_330);
                local_30c = iVar4;
                if (iVar4 < 0) {
                  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar9,"The number of locals must be >= 0.");
                  __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                this->mLocalsSet = true;
                Loader::Function::setNumLocals(currentFunction,iVar4);
                local_48 = 1;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,".local");
                if (bVar2) {
                  if ((this->mLocalsSet & 1U) == 0) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar9,"The locals must been set.");
                    __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  nextToken_abi_cxx11_(&local_358);
                  iVar4 = std::__cxx11::stoi((string *)&local_358,(size_t *)0x0,10);
                  std::__cxx11::string::~string((string *)&local_358);
                  local_358._36_4_ = iVar4;
                  nextToken_abi_cxx11_((ByteCodeParser *)local_378);
                  uVar1 = local_358._36_4_;
                  if (((int)local_358._36_4_ < 0) ||
                     (sVar8 = Loader::Function::numLocals(currentFunction), (int)sVar8 <= (int)uVar1
                     )) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar9,"Invalid local index.");
                    __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  this_00 = Loader::Function::localTypes_abi_cxx11_(currentFunction);
                  this_01 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::at(this_00,(long)(int)local_358._36_4_);
                  std::__cxx11::string::operator=((string *)this_01,(string *)local_378);
                  local_48 = 1;
                  std::__cxx11::string::~string((string *)local_378);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"ldloc");
                  if ((bVar2) ||
                     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"stloc"), bVar2)) {
                    if ((this->mLocalsSet & 1U) == 0) {
                      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar9,"The locals must be set.");
                      __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    nextToken_abi_cxx11_((ByteCodeParser *)local_3a0);
                    iVar4 = std::__cxx11::stoi((string *)local_3a0,(size_t *)0x0,10);
                    std::__cxx11::string::~string((string *)local_3a0);
                    local_37c = iVar4;
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"ldloc");
                    iVar4 = local_37c;
                    local_bee = LOAD_LOCAL;
                    if (!bVar2) {
                      local_bee = STORE_LOCAL;
                    }
                    local_3a1 = local_bee;
                    if ((local_37c < 0) ||
                       (sVar8 = Loader::Function::numLocals(currentFunction), (int)sVar8 <= iVar4))
                    {
                      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar9,"The local index is out of range.");
                      __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    pvVar6 = Loader::Function::instructions(currentFunction);
                    Loader::Instruction::makeWithInt((Instruction *)local_410,local_3a1,local_37c);
                    std::
                    vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                    ::push_back(pvVar6,(value_type *)local_410);
                    Loader::Instruction::~Instruction((Instruction *)local_410);
                    local_48 = 1;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"call");
                    if ((bVar2) ||
                       ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"callinst"), bVar2 ||
                        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"callvirt"), bVar2)))) {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"callinst");
                      local_c15 = true;
                      if (!bVar2) {
                        local_c15 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"callvirt");
                      }
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"callvirt");
                      nextToken_abi_cxx11_((ByteCodeParser *)local_438);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_458,"",(allocator *)((long)&classNamePosition + 7));
                      std::allocator<char>::~allocator
                                ((allocator<char> *)((long)&classNamePosition + 7));
                      if (local_c15 != false) {
                        local_468 = std::__cxx11::string::find(local_438,0x25b169);
                        if (local_468 == -1) {
                          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar9,"Expected \'::\' in called member function.");
                          __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        std::__cxx11::string::substr((ulong)local_488,(ulong)local_438);
                        std::__cxx11::string::operator=(local_458,local_488);
                        std::__cxx11::string::~string(local_488);
                        std::__cxx11::string::substr((ulong)local_4a8,(ulong)local_438);
                        std::__cxx11::string::operator=((string *)local_438,local_4a8);
                        std::__cxx11::string::~string(local_4a8);
                      }
                      nextToken_abi_cxx11_
                                ((ByteCodeParser *)
                                 &parameters.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&parameters.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ,"(");
                      std::__cxx11::string::~string
                                ((string *)
                                 &parameters.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (bVar3) {
                        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar9,"Expected \'(\' after called function.");
                        __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_4e0);
                      readCallParameters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_4e0);
                      if (local_c15 == false) {
                        pvVar6 = Loader::Function::instructions(currentFunction);
                        std::__cxx11::string::string(local_6e8,(string *)local_438);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_700,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_4e0);
                        Loader::Instruction::makeCall
                                  (&local_6c8,(string *)local_6e8,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_700);
                        std::
                        vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                        ::push_back(pvVar6,&local_6c8);
                        Loader::Instruction::~Instruction(&local_6c8);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_700);
                        std::__cxx11::string::~string(local_6e8);
                      }
                      else if (bVar2) {
                        pvVar6 = Loader::Function::instructions(currentFunction);
                        std::__cxx11::string::string(local_628,local_458);
                        std::__cxx11::string::string(local_648,(string *)local_438);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_660,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_4e0);
                        Loader::Instruction::makeCallVirtual
                                  (&local_608,(string *)local_628,(string *)local_648,&local_660);
                        std::
                        vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                        ::push_back(pvVar6,&local_608);
                        Loader::Instruction::~Instruction(&local_608);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_660);
                        std::__cxx11::string::~string(local_648);
                        std::__cxx11::string::~string(local_628);
                      }
                      else {
                        pvVar6 = Loader::Function::instructions(currentFunction);
                        std::__cxx11::string::string(local_568,local_458);
                        std::__cxx11::string::string(local_588,(string *)local_438);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_5a0,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_4e0);
                        Loader::Instruction::makeCallInstance
                                  (&local_548,(string *)local_568,(string *)local_588,&local_5a0);
                        std::
                        vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                        ::push_back(pvVar6,&local_548);
                        Loader::Instruction::~Instruction(&local_548);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_5a0);
                        std::__cxx11::string::~string(local_588);
                        std::__cxx11::string::~string(local_568);
                      }
                      local_48 = 1;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_4e0);
                      std::__cxx11::string::~string(local_458);
                      std::__cxx11::string::~string((string *)local_438);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"ldarg");
                      if (bVar2) {
                        nextToken_abi_cxx11_(&local_728);
                        iVar4 = std::__cxx11::stoi((string *)&local_728,(size_t *)0x0,10);
                        std::__cxx11::string::~string((string *)&local_728);
                        local_728._36_4_ = iVar4;
                        pvVar6 = Loader::Function::instructions(currentFunction);
                        Loader::Instruction::makeWithInt(&local_790,LOAD_ARG,local_728._36_4_);
                        std::
                        vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                        ::push_back(pvVar6,&local_790);
                        Loader::Instruction::~Instruction(&local_790);
                        local_48 = 1;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_38,"newobj");
                        if (bVar2) {
                          nextToken_abi_cxx11_((ByteCodeParser *)local_7b0);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_7d0,"",(allocator *)((long)&classNamePosition_1 + 7));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)((long)&classNamePosition_1 + 7));
                          local_7e0 = std::__cxx11::string::find(local_7b0,0x25b169);
                          if (local_7e0 == -1) {
                            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar9,
                                       "Expected \'::\' after the type in a new object instruction."
                                      );
                            __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          std::__cxx11::string::substr((ulong)local_800,(ulong)local_7b0);
                          std::__cxx11::string::operator=(local_7d0,local_800);
                          std::__cxx11::string::~string(local_800);
                          std::__cxx11::string::substr((ulong)local_820,(ulong)local_7b0);
                          std::__cxx11::string::operator=((string *)local_7b0,local_820);
                          std::__cxx11::string::~string(local_820);
                          bVar2 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_7b0,".constructor");
                          if (bVar2) {
                            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar9,"Expected call to constructor.");
                            __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          nextToken_abi_cxx11_
                                    ((ByteCodeParser *)
                                     &parameters_1.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          bVar2 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&parameters_1.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,"(");
                          std::__cxx11::string::~string
                                    ((string *)
                                     &parameters_1.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          if (bVar2) {
                            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar9,"Expected \'(\' after called function.");
                            __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_858);
                          readCallParameters(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_858);
                          pvVar6 = Loader::Function::instructions(currentFunction);
                          std::__cxx11::string::string(local_8e0,local_7d0);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_8f8,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_858);
                          Loader::Instruction::makeNewObject
                                    (&local_8c0,(string *)local_8e0,
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_8f8);
                          std::
                          vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                          ::push_back(pvVar6,&local_8c0);
                          Loader::Instruction::~Instruction(&local_8c0);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_8f8);
                          std::__cxx11::string::~string(local_8e0);
                          local_48 = 1;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_858);
                          std::__cxx11::string::~string(local_7d0);
                          std::__cxx11::string::~string((string *)local_7b0);
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"br");
                          if (bVar2) {
                            nextToken_abi_cxx11_(&local_920);
                            iVar4 = std::__cxx11::stoi((string *)&local_920,(size_t *)0x0,10);
                            std::__cxx11::string::~string((string *)&local_920);
                            local_920._36_4_ = iVar4;
                            pvVar6 = Loader::Function::instructions(currentFunction);
                            Loader::Instruction::makeWithInt
                                      ((Instruction *)&stack0xfffffffffffff678,BRANCH,
                                       local_920._36_4_);
                            std::
                            vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                            ::push_back(pvVar6,(value_type *)&stack0xfffffffffffff678);
                            Loader::Instruction::~Instruction
                                      ((Instruction *)&stack0xfffffffffffff678);
                            local_48 = 1;
                          }
                          else {
                            sVar5 = std::
                                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                                    ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                                             *)(anonymous_namespace)::branchInstructions_abi_cxx11_,
                                            (key_type *)local_38);
                            if (sVar5 == 0) {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"ldstr");
                              if (!bVar2) {
                                prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                                currentToken_abi_cxx11_(&local_b00);
                                std::operator+(&local_b00.mLocalsSet,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)0x25ef66);
                                std::operator+(local_ac0,&local_b00.mLocalsSet);
                                std::runtime_error::runtime_error(prVar9,(string *)local_ac0);
                                __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              pvVar6 = Loader::Function::instructions(currentFunction);
                              nextToken_abi_cxx11_((ByteCodeParser *)local_aa0);
                              Loader::Instruction::makeWithStringConstant
                                        ((Instruction *)(local_aa0 + 0x20),LOAD_STRING,
                                         (string *)local_aa0);
                              std::
                              vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                              ::push_back(pvVar6,(value_type *)(local_aa0 + 0x20));
                              Loader::Instruction::~Instruction((Instruction *)(local_aa0 + 0x20));
                              std::__cxx11::string::~string((string *)local_aa0);
                              local_48 = 1;
                            }
                            else {
                              nextToken_abi_cxx11_(&local_9b0);
                              iVar4 = std::__cxx11::stoi((string *)&local_9b0,(size_t *)0x0,10);
                              std::__cxx11::string::~string((string *)&local_9b0);
                              local_9b0._36_4_ = iVar4;
                              pvVar6 = Loader::Function::instructions(currentFunction);
                              pmVar7 = std::
                                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                                       ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                                             *)(anonymous_namespace)::branchInstructions_abi_cxx11_,
                                            (key_type *)local_38);
                              Loader::Instruction::makeWithInt(&local_a18,*pmVar7,local_9b0._36_4_);
                              std::
                              vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                              ::push_back(pvVar6,&local_a18);
                              Loader::Instruction::~Instruction(&local_a18);
                              local_48 = 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              nextToken_abi_cxx11_((ByteCodeParser *)local_280);
              pvVar6 = Loader::Function::instructions(currentFunction);
              pmVar7 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                       ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                             *)(anonymous_namespace)::stringOperandInstructions_abi_cxx11_,
                            (key_type *)local_38);
              opCode_00 = *pmVar7;
              std::__cxx11::string::string(local_308,(string *)local_280);
              Loader::Instruction::makeWithString(&local_2e8,opCode_00,(string *)local_308);
              std::
              vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
              ::push_back(pvVar6,&local_2e8);
              Loader::Instruction::~Instruction(&local_2e8);
              std::__cxx11::string::~string(local_308);
              local_48 = 1;
              std::__cxx11::string::~string((string *)local_280);
            }
          }
          else {
            pvVar6 = Loader::Function::instructions(currentFunction);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                     ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>_>
                           *)(anonymous_namespace)::noOperandsInstructions_abi_cxx11_,
                          (key_type *)local_38);
            Loader::Instruction::make(&local_260,*pmVar7);
            std::
            vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
            push_back(pvVar6,&local_260);
            Loader::Instruction::~Instruction(&local_260);
            local_48 = 1;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ByteCodeParser::parseInstruction(Loader::Function& currentFunction) {
		using namespace Loader;
		auto currentToLower = currentTokenToLower();

		if (currentToLower == "@") {
			parseAttribute(currentFunction.attributes());
			return;
		}

		if (currentToLower == "ldint") {
			int value = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::LOAD_INT, value));
			return;
		}

		if (currentToLower == "ldfloat") {
			float value = stof(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithFloat(OpCodes::LOAD_FLOAT, value));
			return;
		}

		if (currentToLower == "ldchar") {
			char value = (char)stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithChar(OpCodes::LOAD_CHAR, value));
			return;
		}

		if (noOperandsInstructions.count(currentToLower) > 0) {
			currentFunction.instructions().push_back(Instruction::make(noOperandsInstructions.at(currentToLower)));
			return;
		}

		if (stringOperandInstructions.count(currentToLower) > 0) {
			std::string value = nextToken();
			currentFunction.instructions().push_back(Instruction::makeWithString(stringOperandInstructions.at(currentToLower), value));
			return;
		}

		if (currentToLower == ".locals") {
			if (!mLocalsSet) {
				int localsCount = stoi(nextToken());

				if (localsCount >= 0) {
					mLocalsSet = true;
					currentFunction.setNumLocals(localsCount);
				} else {
					throw std::runtime_error("The number of locals must be >= 0.");
				}

				return;
			} else {
				throw std::runtime_error("The locals has already been set.");
			}
		}

		if (currentToLower == ".local") {
			if (mLocalsSet) {
				int localIndex = stoi(nextToken());
				auto localType = nextToken();

				if (localIndex >= 0 && localIndex < (int)currentFunction.numLocals()) {
					currentFunction.localTypes().at((std::size_t)localIndex) = localType;
				} else {
					throw std::runtime_error("Invalid local index.");
				}

				return;
			} else {
				throw std::runtime_error("The locals must been set.");
			}
		}

		if (currentToLower == "ldloc" || currentToLower == "stloc") {
			if (!mLocalsSet) {
				throw std::runtime_error("The locals must be set.");
			}

			int local = stoi(nextToken());
			auto opCode = currentToLower == "ldloc" ? OpCodes::LOAD_LOCAL : OpCodes::STORE_LOCAL;

			if (local >= 0 && local < (int)currentFunction.numLocals()) {
				currentFunction.instructions().push_back(Instruction::makeWithInt(opCode, local));
				return;
			} else {
				throw std::runtime_error("The local index is out of range.");
			}
		}

		if (currentToLower == "call" || currentToLower == "callinst" || currentToLower == "callvirt") {
			bool isInstance = currentToLower == "callinst" || currentToLower == "callvirt";
			bool isVirtual = currentToLower == "callvirt";

			auto funcName = nextToken();
			std::string classType = "";

			if (isInstance) {
				auto classNamePosition = funcName.find("::");
				if (classNamePosition != std::string::npos) {
					classType = funcName.substr(0, classNamePosition);
				} else {
					throw std::runtime_error("Expected '::' in called member function.");
				}

				funcName = funcName.substr(classNamePosition + 2);
			}

			if (nextToken() != "(") {
				throw std::runtime_error("Expected '(' after called function.");
			}

			std::vector<std::string> parameters;
			readCallParameters(parameters);

			if (isInstance) {
				if (!isVirtual) {
					currentFunction.instructions().push_back(Instruction::makeCallInstance(classType, funcName, parameters));
				} else {
					currentFunction.instructions().push_back(Instruction::makeCallVirtual(classType, funcName, parameters));
				}
			} else {
				currentFunction.instructions().push_back(Instruction::makeCall(funcName, parameters));
			}

			return;
		}

		if (currentToLower == "ldarg") {
			int argumentNum = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::LOAD_ARG, argumentNum));
			return;
		}

		if (currentToLower == "newobj") {
			auto funcName = nextToken();
			std::string classType = "";

			auto classNamePosition = funcName.find("::");
			if (classNamePosition != std::string::npos) {
				classType = funcName.substr(0, classNamePosition);
			} else {
				throw std::runtime_error("Expected '::' after the type in a new object instruction.");
			}

			funcName = funcName.substr(classNamePosition + 2);

			if (funcName != ".constructor") {
				throw std::runtime_error("Expected call to constructor.");
			}

			if (nextToken() != "(") {
				throw std::runtime_error("Expected '(' after called function.");
			}

			std::vector<std::string> parameters;
			readCallParameters(parameters);
			currentFunction.instructions().push_back(Instruction::makeNewObject(classType, parameters));
			return;
		}

		if (currentToLower == "br") {
			int target = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::BRANCH, target));
			return;
		}

		if (branchInstructions.count(currentToLower) > 0) {
			int target = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(branchInstructions.at(currentToLower), target));
			return;
		}

		if (currentToLower == "ldstr") {
			currentFunction.instructions().push_back(Instruction::makeWithStringConstant(OpCodes::LOAD_STRING, nextToken()));
			return;
		}

		throw std::runtime_error("'" + currentToken() + "' is not a valid instruction.");
	}